

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O1

bool __thiscall irr::gui::IGUIElement::sendToBack(IGUIElement *this,IGUIElement *child)

{
  size_t *psVar1;
  IGUIElement *pIVar2;
  _List_node_base *p_Var3;
  
  pIVar2 = child->Parent;
  if ((pIVar2 == this) &&
     (p_Var3 = (child->ParentPos)._M_node,
     p_Var3 != (this->Children).
               super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>.
               _M_impl._M_node.super__List_node_base._M_next)) {
    psVar1 = &(this->Children).
              super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    ::std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x18);
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)child;
    ::std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->Children).
              super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    (child->ParentPos)._M_node = p_Var3;
  }
  return pIVar2 == this;
}

Assistant:

virtual bool sendToBack(IGUIElement *child)
	{
		if (child->Parent != this)
			return false;
		if (child->ParentPos == Children.begin()) // already there
			return true;
		Children.erase(child->ParentPos);
		child->ParentPos = Children.insert(Children.begin(), child);
		return true;
	}